

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CallDebugHook(SQVM *this,SQInteger type,SQInteger forcedline)

{
  SQFunctionProto *this_00;
  SQVM *in_RDX;
  SQInteger in_RSI;
  long in_RDI;
  SQInteger nparams;
  SQObjectPtr temp_reg;
  SQInteger line;
  SQChar *fname;
  SQChar *src;
  SQFunctionProto *func;
  SQObjectPtr *in_stack_ffffffffffffff48;
  SQVM *in_stack_ffffffffffffff50;
  SQVM *in_stack_ffffffffffffff60;
  _HashNode **local_98;
  _HashNode **local_90;
  SQObjectPtr local_80;
  SQObjectPtr local_70 [2];
  SQBool raiseerror;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQObjectValue in_stack_ffffffffffffffc0;
  SQInteger in_stack_ffffffffffffffc8;
  SQObjectPtr *in_stack_ffffffffffffffd0;
  SQVM *in_stack_ffffffffffffffd8;
  
  *(undefined1 *)(in_RDI + 0x90) = 0;
  this_00 = *(SQFunctionProto **)(*(long *)(*(long *)(in_RDI + 0x108) + 0x18) + 0x48);
  if (*(long *)(in_RDI + 0x98) == 0) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb8);
    raiseerror = 5;
    Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ::SQObjectPtr::SQObjectPtr(local_70,in_RSI);
    Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
    Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (in_RDX == (SQVM *)0x0) {
      in_stack_ffffffffffffff50 =
           (SQVM *)SQFunctionProto::GetLine
                             (this_00,(SQInstruction *)**(undefined8 **)(in_RDI + 0x108));
      in_RDX = in_stack_ffffffffffffff50;
    }
    ::SQObjectPtr::SQObjectPtr(&local_80,(SQInteger)in_RDX);
    Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
    Push(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    Call(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
         in_stack_ffffffffffffffc0.nInteger,in_stack_ffffffffffffffb8,raiseerror);
    Pop(in_stack_ffffffffffffff60,(SQInteger)in_RDX);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff50);
  }
  else {
    if ((this_00->_sourcename).super_SQObject._type == OT_STRING) {
      local_90 = &((this_00->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
    }
    else {
      local_90 = (_HashNode **)0x0;
    }
    if ((this_00->_name).super_SQObject._type == OT_STRING) {
      local_98 = &((this_00->_name).super_SQObject._unVal.pTable)->_firstfree;
    }
    else {
      local_98 = (_HashNode **)0x0;
    }
    if (in_RDX == (SQVM *)0x0) {
      in_RDX = (SQVM *)SQFunctionProto::GetLine
                                 (this_00,(SQInstruction *)**(undefined8 **)(in_RDI + 0x108));
    }
    (**(code **)(in_RDI + 0x98))(in_RDI,in_RSI,local_90,in_RDX,local_98);
  }
  *(undefined1 *)(in_RDI + 0x90) = 1;
  return;
}

Assistant:

void SQVM::CallDebugHook(SQInteger type,SQInteger forcedline)
{
    _debughook = false;
    SQFunctionProto *func=_closure(ci->_closure)->_function;
    if(_debughook_native) {
        const SQChar *src = sq_type(func->_sourcename) == OT_STRING?_stringval(func->_sourcename):NULL;
        const SQChar *fname = sq_type(func->_name) == OT_STRING?_stringval(func->_name):NULL;
        SQInteger line = forcedline?forcedline:func->GetLine(ci->_ip);
        _debughook_native(this,type,src,line,fname);
    }
    else {
        SQObjectPtr temp_reg;
        SQInteger nparams=5;
        Push(_roottable); Push(type); Push(func->_sourcename); Push(forcedline?forcedline:func->GetLine(ci->_ip)); Push(func->_name);
        Call(_debughook_closure,nparams,_top-nparams,temp_reg,SQFalse);
        Pop(nparams);
    }
    _debughook = true;
}